

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Rectify::backward_impl
          (Rectify *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  int iVar24;
  int iVar25;
  
  uVar12 = (ulong)(fx->d).nd;
  iVar25 = 1;
  iVar24 = 1;
  if (uVar12 != 0) {
    auVar16 = vpbroadcastq_avx512f();
    auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar13 = 0;
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar20 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpbroadcastq_avx512f();
      auVar21 = vporq_avx512f(auVar17,auVar18);
      auVar17 = vporq_avx512f(auVar17,auVar19);
      uVar7 = vpcmpuq_avx512f(auVar17,auVar16,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar21,auVar16,2);
      bVar9 = (byte)uVar7;
      uVar14 = CONCAT11(bVar9,bVar8);
      auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar13));
      auVar21._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
      auVar21._0_4_ = (uint)(bVar8 & 1) * auVar17._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
      auVar21._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
      auVar21._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
      auVar21._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
      auVar21._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
      auVar21._32_4_ = (uint)(bVar9 & 1) * auVar17._32_4_;
      auVar21._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar17._36_4_;
      auVar21._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar17._40_4_;
      auVar21._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar17._44_4_;
      auVar21._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar17._48_4_;
      auVar21._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar17._52_4_;
      auVar21._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar17._56_4_;
      auVar21._60_4_ = (uint)(bVar9 >> 7) * auVar17._60_4_;
      auVar17 = vpmulld_avx512f(auVar21,auVar20);
      uVar13 = uVar13 + 0x10;
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
    auVar17 = vmovdqa32_avx512f(auVar17);
    auVar16._0_4_ = (uint)(bVar8 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._0_4_;
    bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar16._4_4_ = (uint)bVar4 * auVar17._4_4_ | (uint)!bVar4 * auVar20._4_4_;
    bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar16._8_4_ = (uint)bVar4 * auVar17._8_4_ | (uint)!bVar4 * auVar20._8_4_;
    bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar16._12_4_ = (uint)bVar4 * auVar17._12_4_ | (uint)!bVar4 * auVar20._12_4_;
    bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar16._16_4_ = (uint)bVar4 * auVar17._16_4_ | (uint)!bVar4 * auVar20._16_4_;
    bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar16._20_4_ = (uint)bVar4 * auVar17._20_4_ | (uint)!bVar4 * auVar20._20_4_;
    bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar16._24_4_ = (uint)bVar4 * auVar17._24_4_ | (uint)!bVar4 * auVar20._24_4_;
    bVar4 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar16._28_4_ = (uint)bVar4 * auVar17._28_4_ | (uint)!bVar4 * auVar20._28_4_;
    auVar16._32_4_ = (uint)(bVar9 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar20._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar16._36_4_ = (uint)bVar4 * auVar17._36_4_ | (uint)!bVar4 * auVar20._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar16._40_4_ = (uint)bVar4 * auVar17._40_4_ | (uint)!bVar4 * auVar20._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar16._44_4_ = (uint)bVar4 * auVar17._44_4_ | (uint)!bVar4 * auVar20._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar16._48_4_ = (uint)bVar4 * auVar17._48_4_ | (uint)!bVar4 * auVar20._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar16._52_4_ = (uint)bVar4 * auVar17._52_4_ | (uint)!bVar4 * auVar20._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar16._56_4_ = (uint)bVar4 * auVar17._56_4_ | (uint)!bVar4 * auVar20._56_4_;
    auVar16._60_4_ =
         (uint)(bVar9 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar20._60_4_;
    auVar15 = vextracti64x4_avx512f(auVar16,1);
    auVar16 = vpmulld_avx512f(auVar16,ZEXT3264(auVar15));
    auVar5 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar24 = auVar5._0_4_;
  }
  uVar12 = (ulong)(dEdf->d).nd;
  if (uVar12 != 0) {
    auVar16 = vpbroadcastq_avx512f();
    auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar13 = 0;
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar20 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpbroadcastq_avx512f();
      auVar21 = vporq_avx512f(auVar17,auVar18);
      auVar17 = vporq_avx512f(auVar17,auVar19);
      uVar7 = vpcmpuq_avx512f(auVar17,auVar16,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar21,auVar16,2);
      bVar9 = (byte)uVar7;
      uVar14 = CONCAT11(bVar9,bVar8);
      auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar13));
      auVar22._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
      auVar22._0_4_ = (uint)(bVar8 & 1) * auVar17._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
      auVar22._32_4_ = (uint)(bVar9 & 1) * auVar17._32_4_;
      auVar22._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar17._36_4_;
      auVar22._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar17._40_4_;
      auVar22._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar17._44_4_;
      auVar22._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar17._48_4_;
      auVar22._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar17._52_4_;
      auVar22._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar17._56_4_;
      auVar22._60_4_ = (uint)(bVar9 >> 7) * auVar17._60_4_;
      auVar17 = vpmulld_avx512f(auVar22,auVar20);
      uVar13 = uVar13 + 0x10;
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
    auVar16 = vmovdqa32_avx512f(auVar17);
    auVar17._0_4_ = (uint)(bVar8 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._0_4_;
    bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar4 * auVar16._4_4_ | (uint)!bVar4 * auVar20._4_4_;
    bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar4 * auVar16._8_4_ | (uint)!bVar4 * auVar20._8_4_;
    bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar4 * auVar16._12_4_ | (uint)!bVar4 * auVar20._12_4_;
    bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar4 * auVar16._16_4_ | (uint)!bVar4 * auVar20._16_4_;
    bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar4 * auVar16._20_4_ | (uint)!bVar4 * auVar20._20_4_;
    bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar4 * auVar16._24_4_ | (uint)!bVar4 * auVar20._24_4_;
    bVar4 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar4 * auVar16._28_4_ | (uint)!bVar4 * auVar20._28_4_;
    auVar17._32_4_ = (uint)(bVar9 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar20._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar17._36_4_ = (uint)bVar4 * auVar16._36_4_ | (uint)!bVar4 * auVar20._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar17._40_4_ = (uint)bVar4 * auVar16._40_4_ | (uint)!bVar4 * auVar20._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar17._44_4_ = (uint)bVar4 * auVar16._44_4_ | (uint)!bVar4 * auVar20._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar17._48_4_ = (uint)bVar4 * auVar16._48_4_ | (uint)!bVar4 * auVar20._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar17._52_4_ = (uint)bVar4 * auVar16._52_4_ | (uint)!bVar4 * auVar20._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar17._56_4_ = (uint)bVar4 * auVar16._56_4_ | (uint)!bVar4 * auVar20._56_4_;
    auVar17._60_4_ =
         (uint)(bVar9 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar20._60_4_;
    auVar15 = vextracti64x4_avx512f(auVar17,1);
    auVar16 = vpmulld_avx512f(auVar17,ZEXT3264(auVar15));
    auVar5 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar25 = auVar5._0_4_;
  }
  uVar10 = iVar25 * (dEdf->d).bd;
  if (iVar24 * (fx->d).bd != uVar10) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<cnn::FRectifyBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FRectifyBackward, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  uVar12 = (ulong)(dEdxi->d).nd;
  if (uVar12 == 0) {
    iVar25 = 1;
  }
  else {
    auVar16 = vpbroadcastq_avx512f();
    auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar13 = 0;
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar20 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpbroadcastq_avx512f();
      auVar21 = vporq_avx512f(auVar17,auVar18);
      auVar17 = vporq_avx512f(auVar17,auVar19);
      uVar7 = vpcmpuq_avx512f(auVar17,auVar16,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar21,auVar16,2);
      bVar9 = (byte)uVar7;
      uVar14 = CONCAT11(bVar9,bVar8);
      auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar13));
      auVar23._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar17._4_4_;
      auVar23._0_4_ = (uint)(bVar8 & 1) * auVar17._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar17._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar17._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar17._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar17._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar17._24_4_;
      auVar23._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar17._28_4_;
      auVar23._32_4_ = (uint)(bVar9 & 1) * auVar17._32_4_;
      auVar23._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar17._36_4_;
      auVar23._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar17._40_4_;
      auVar23._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar17._44_4_;
      auVar23._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar17._48_4_;
      auVar23._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar17._52_4_;
      auVar23._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar17._56_4_;
      auVar23._60_4_ = (uint)(bVar9 >> 7) * auVar17._60_4_;
      auVar17 = vpmulld_avx512f(auVar23,auVar20);
      uVar13 = uVar13 + 0x10;
    } while ((uVar12 + 0xf & 0x1fffffff0) != uVar13);
    auVar16 = vmovdqa32_avx512f(auVar17);
    auVar18._0_4_ = (uint)(bVar8 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._0_4_;
    bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar4 * auVar16._4_4_ | (uint)!bVar4 * auVar20._4_4_;
    bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar4 * auVar16._8_4_ | (uint)!bVar4 * auVar20._8_4_;
    bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar4 * auVar16._12_4_ | (uint)!bVar4 * auVar20._12_4_;
    bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar4 * auVar16._16_4_ | (uint)!bVar4 * auVar20._16_4_;
    bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar4 * auVar16._20_4_ | (uint)!bVar4 * auVar20._20_4_;
    bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar4 * auVar16._24_4_ | (uint)!bVar4 * auVar20._24_4_;
    bVar4 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar4 * auVar16._28_4_ | (uint)!bVar4 * auVar20._28_4_;
    auVar18._32_4_ = (uint)(bVar9 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar20._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar4 * auVar16._36_4_ | (uint)!bVar4 * auVar20._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar4 * auVar16._40_4_ | (uint)!bVar4 * auVar20._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar4 * auVar16._44_4_ | (uint)!bVar4 * auVar20._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar4 * auVar16._48_4_ | (uint)!bVar4 * auVar20._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar4 * auVar16._52_4_ | (uint)!bVar4 * auVar20._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar4 * auVar16._56_4_ | (uint)!bVar4 * auVar20._56_4_;
    auVar18._60_4_ =
         (uint)(bVar9 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar20._60_4_;
    auVar15 = vextracti64x4_avx512f(auVar18,1);
    auVar16 = vpmulld_avx512f(auVar18,ZEXT3264(auVar15));
    auVar5 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpmulld_avx(auVar5,auVar6);
    iVar25 = auVar5._0_4_;
  }
  uVar11 = iVar25 * (dEdxi->d).bd;
  if (uVar11 != uVar10) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::FRectifyBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  if ((ulong)uVar11 != 0) {
    pfVar1 = fx->v;
    pfVar2 = dEdf->v;
    pfVar3 = dEdxi->v;
    uVar12 = 0;
    do {
      uVar7 = vcmpss_avx512f((undefined1  [16])0x0,ZEXT416((uint)pfVar1[uVar12]),4);
      pfVar3[uVar12] = (float)((uint)((byte)uVar7 & 1) * (int)pfVar2[uVar12]) + pfVar3[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  return;
}

Assistant:

void Rectify::backward_impl(const vector<const Tensor*>& xs,
                         const Tensor& fx,
                         const Tensor& dEdf,
                         unsigned i,
                         Tensor& dEdxi) const {
#if HAVE_CUDA
  gpu::vrelu_backward(fx.d.size(), fx.v, dEdf.v, dEdxi.v);
#else
  dEdxi.vec() += fx.vec().binaryExpr(dEdf.vec(), FRectifyBackward());
#endif
}